

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O0

vrna_param_t * get_scaled_params(vrna_md_t *md)

{
  int iVar1;
  int iVar2;
  vrna_param_t *pvVar3;
  char *pcVar4;
  size_t sVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_54;
  int local_50;
  int n;
  int m_1;
  int m;
  int dd;
  int mm;
  double GQuadBeta_T;
  double GQuadAlpha_T;
  vrna_param_t *params;
  double tempf;
  uint l;
  uint k;
  uint j;
  uint i;
  vrna_md_t *md_local;
  
  pvVar3 = (vrna_param_t *)vrna_alloc(0x33ea8);
  memset(pvVar3->param_file,0,0x100);
  pcVar4 = last_parameter_file();
  if (pcVar4 != (char *)0x0) {
    pcVar4 = last_parameter_file();
    strncpy(pvVar3->param_file,pcVar4,0xff);
  }
  memcpy(&pvVar3->model_details,md,0x7e8);
  pvVar3->temperature = md->temperature;
  dVar6 = (pvVar3->temperature + 273.15) / Tmeasure;
  pvVar3->ninio[2] = (int)(-(double)(niniodH - ninio37) * dVar6 + (double)niniodH);
  pvVar3->lxc = lxc37 * dVar6;
  pvVar3->TripleC = (int)(-(double)(TripleCdH - TripleC37) * dVar6 + (double)TripleCdH);
  pvVar3->MultipleCA = (int)(-(double)(MultipleCAdH - MultipleCA37) * dVar6 + (double)MultipleCAdH);
  pvVar3->MultipleCB = (int)(-(double)(MultipleCBdH - MultipleCB37) * dVar6 + (double)MultipleCBdH);
  pvVar3->TerminalAU = (int)(-(double)(TerminalAUdH - TerminalAU37) * dVar6 + (double)TerminalAUdH);
  pvVar3->DuplexInit = (int)(-(double)(DuplexInitdH - DuplexInit37) * dVar6 + (double)DuplexInitdH);
  pvVar3->MLbase = (int)(-(double)(ML_BASEdH - ML_BASE37) * dVar6 + (double)ML_BASEdH);
  pvVar3->PS_penalty = -0x8a;
  pvVar3->PSM_penalty = 0x3ef;
  pvVar3->PSP_penalty = 0x5dc;
  pvVar3->PB_penalty = 0xf6;
  pvVar3->PUP_penalty = 6;
  pvVar3->PPS_penalty = 0x60;
  pvVar3->e_stP_penalty = 0.89;
  pvVar3->e_intP_penalty = 0.74;
  pvVar3->ap_penalty = 0x155;
  pvVar3->bp_penalty = 0x38;
  pvVar3->cp_penalty = 0xc;
  pvVar3->a_penalty = 0x153;
  pvVar3->b_penalty = 3;
  pvVar3->c_penalty = 2;
  pvVar3->MLclosing = (int)(-(double)(ML_closingdH - ML_closing37) * dVar6 + (double)ML_closingdH);
  pvVar3->gquadLayerMismatch =
       (int)(-(double)(GQuadLayerMismatchH - GQuadLayerMismatch37) * dVar6 +
            (double)GQuadLayerMismatchH);
  pvVar3->gquadLayerMismatchMax = GQuadLayerMismatchMax;
  for (k = 2; k < 8; k = k + 1) {
    for (l = 3; l < 0x2e; l = l + 1) {
      dVar7 = (double)GQuadAlphadH;
      iVar1 = GQuadAlphadH - GQuadAlpha37;
      dVar8 = (double)GQuadBetadH;
      iVar2 = GQuadBetadH - GQuadBeta37;
      dVar9 = log((double)(l - 2));
      pvVar3->gquad[k][l] =
           (int)(dVar7 - (double)iVar1 * dVar6) * (k - 1) +
           (int)((dVar8 - (double)iVar2 * dVar6) * dVar9);
    }
  }
  for (k = 0; k < 0x1f; k = k + 1) {
    pvVar3->hairpin[k] =
         (int)(-(double)(hairpindH[k] - hairpin37[k]) * dVar6 + (double)hairpindH[k]);
  }
  for (k = 0; k < 0x1f; k = k + 1) {
    pvVar3->bulge[k] = (int)(-(double)(bulgedH[k] - bulge37[k]) * dVar6 + (double)bulgedH[k]);
    pvVar3->internal_loop[k] =
         (int)(-(double)(internal_loopdH[k] - internal_loop37[k]) * dVar6 +
              (double)internal_loopdH[k]);
  }
  for (; k < 0x1f; k = k + 1) {
    iVar1 = pvVar3->bulge[0x1e];
    dVar7 = pvVar3->lxc;
    dVar8 = log((double)k / 30.0);
    pvVar3->bulge[k] = iVar1 + (int)(dVar7 * dVar8);
    iVar1 = pvVar3->internal_loop[0x1e];
    dVar7 = pvVar3->lxc;
    dVar8 = log((double)k / 30.0);
    pvVar3->internal_loop[k] = iVar1 + (int)(dVar7 * dVar8);
  }
  for (k = 0; sVar5 = strlen(Tetraloops), k * 7 < sVar5; k = k + 1) {
    pvVar3->Tetraloop_E[k] =
         (int)(-(double)(TetraloopdH[k] - Tetraloop37[k]) * dVar6 + (double)TetraloopdH[k]);
  }
  for (k = 0; sVar5 = strlen(Triloops), k * 5 < sVar5; k = k + 1) {
    pvVar3->Triloop_E[k] =
         (int)(-(double)(TriloopdH[k] - Triloop37[k]) * dVar6 + (double)TriloopdH[k]);
  }
  for (k = 0; sVar5 = strlen(Hexaloops), k * 9 < sVar5; k = k + 1) {
    pvVar3->Hexaloop_E[k] =
         (int)(-(double)(HexaloopdH[k] - Hexaloop37[k]) * dVar6 + (double)HexaloopdH[k]);
  }
  for (k = 0; k < 8; k = k + 1) {
    pvVar3->MLintern[k] = (int)(-(double)(ML_interndH - ML_intern37) * dVar6 + (double)ML_interndH);
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      pvVar3->stack[k][l] =
           (int)(-(double)(stackdH[k][l] - stack37[k][l]) * dVar6 + (double)stackdH[k][l]);
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 5; l = l + 1) {
      for (tempf._4_4_ = 0; tempf._4_4_ < 5; tempf._4_4_ = tempf._4_4_ + 1) {
        pvVar3->mismatchI[k][l][tempf._4_4_] =
             (int)(-(double)(mismatchIdH[k][l][tempf._4_4_] - mismatchI37[k][l][tempf._4_4_]) *
                   dVar6 + (double)mismatchIdH[k][l][tempf._4_4_]);
        pvVar3->mismatchH[k][l][tempf._4_4_] =
             (int)(-(double)(mismatchHdH[k][l][tempf._4_4_] - mismatchH37[k][l][tempf._4_4_]) *
                   dVar6 + (double)mismatchHdH[k][l][tempf._4_4_]);
        pvVar3->mismatch1nI[k][l][tempf._4_4_] =
             (int)(-(double)(mismatch1nIdH[k][l][tempf._4_4_] - mismatch1nI37[k][l][tempf._4_4_]) *
                   dVar6 + (double)mismatch1nIdH[k][l][tempf._4_4_]);
        pvVar3->mismatch23I[k][l][tempf._4_4_] =
             (int)(-(double)(mismatch23IdH[k][l][tempf._4_4_] - mismatch23I37[k][l][tempf._4_4_]) *
                   dVar6 + (double)mismatch23IdH[k][l][tempf._4_4_]);
        if (md->dangles == 0) {
          pvVar3->mismatchExt[k][l][tempf._4_4_] = 0;
          pvVar3->mismatchM[k][l][tempf._4_4_] = 0;
        }
        else {
          local_ac = (int)(-(double)(mismatchMdH[k][l][tempf._4_4_] - mismatchM37[k][l][tempf._4_4_]
                                    ) * dVar6 + (double)mismatchMdH[k][l][tempf._4_4_]);
          if (0 < local_ac) {
            local_ac = 0;
          }
          pvVar3->mismatchM[k][l][tempf._4_4_] = local_ac;
          local_b0 = (int)(-(double)(mismatchExtdH[k][l][tempf._4_4_] -
                                    mismatchExt37[k][l][tempf._4_4_]) * dVar6 +
                          (double)mismatchExtdH[k][l][tempf._4_4_]);
          if (0 < local_b0) {
            local_b0 = 0;
          }
          pvVar3->mismatchExt[k][l][tempf._4_4_] = local_b0;
        }
      }
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 5; l = l + 1) {
      local_b4 = (int)(-(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar6 +
                      (double)dangle5_dH[k][l]);
      if (0 < local_b4) {
        local_b4 = 0;
      }
      pvVar3->dangle5[k][l] = local_b4;
      local_b8 = (int)(-(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar6 +
                      (double)dangle3_dH[k][l]);
      if (0 < local_b8) {
        local_b8 = 0;
      }
      pvVar3->dangle3[k][l] = local_b8;
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      for (tempf._4_4_ = 0; tempf._4_4_ < 5; tempf._4_4_ = tempf._4_4_ + 1) {
        for (tempf._0_4_ = 0; tempf._0_4_ < 5; tempf._0_4_ = tempf._0_4_ + 1) {
          pvVar3->int11[k][l][tempf._4_4_][tempf._0_4_] =
               (int)(-(double)(int11_dH[k][l][tempf._4_4_][tempf._0_4_] -
                              int11_37[k][l][tempf._4_4_][tempf._0_4_]) * dVar6 +
                    (double)int11_dH[k][l][tempf._4_4_][tempf._0_4_]);
        }
      }
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      for (tempf._4_4_ = 0; tempf._4_4_ < 5; tempf._4_4_ = tempf._4_4_ + 1) {
        for (tempf._0_4_ = 0; tempf._0_4_ < 5; tempf._0_4_ = tempf._0_4_ + 1) {
          for (n = 0; n < 5; n = n + 1) {
            pvVar3->int21[k][l][tempf._4_4_][tempf._0_4_][n] =
                 (int)(-(double)(int21_dH[k][l][tempf._4_4_][tempf._0_4_][n] -
                                int21_37[k][l][tempf._4_4_][tempf._0_4_][n]) * dVar6 +
                      (double)int21_dH[k][l][tempf._4_4_][tempf._0_4_][n]);
          }
        }
      }
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      for (tempf._4_4_ = 0; tempf._4_4_ < 5; tempf._4_4_ = tempf._4_4_ + 1) {
        for (tempf._0_4_ = 0; tempf._0_4_ < 5; tempf._0_4_ = tempf._0_4_ + 1) {
          for (local_50 = 0; local_50 < 5; local_50 = local_50 + 1) {
            for (local_54 = 0; local_54 < 5; local_54 = local_54 + 1) {
              pvVar3->int22[k][l][tempf._4_4_][tempf._0_4_][local_50][local_54] =
                   (int)(-(double)(int22_dH[k][l][tempf._4_4_][tempf._0_4_][local_50][local_54] -
                                  int22_37[k][l][tempf._4_4_][tempf._0_4_][local_50][local_54]) *
                         dVar6 + (double)int22_dH[k][l][tempf._4_4_][tempf._0_4_][local_50]
                                         [local_54]);
            }
          }
        }
      }
    }
  }
  strncpy(pvVar3->Tetraloops,Tetraloops,0x119);
  strncpy(pvVar3->Triloops,Triloops,0xf1);
  strncpy(pvVar3->Hexaloops,Hexaloops,0x169);
  id = id + 1;
  pvVar3->id = id;
  return pvVar3;
}

Assistant:

PRIVATE vrna_param_t *
get_scaled_params(vrna_md_t *md)
{
  unsigned int  i, j, k, l;
  double        tempf;
  vrna_param_t  *params;

  params = (vrna_param_t *)vrna_alloc(sizeof(vrna_param_t));

  memset(params->param_file, '\0', 256);
  if (last_parameter_file() != NULL)
    strncpy(params->param_file, last_parameter_file(), 255);

  params->model_details = *md;  /* copy over the model details */
  params->temperature   = md->temperature;
  tempf                 = ((params->temperature + K0) / Tmeasure);

  params->ninio[2]              = RESCALE_dG(ninio37, niniodH, tempf);
  params->lxc                   = lxc37 * tempf;
  params->TripleC               = RESCALE_dG(TripleC37, TripleCdH, tempf);
  params->MultipleCA            = RESCALE_dG(MultipleCA37, MultipleCAdH, tempf);
  params->MultipleCB            = RESCALE_dG(MultipleCB37, MultipleCBdH, tempf);
  params->TerminalAU            = RESCALE_dG(TerminalAU37, TerminalAUdH, tempf);
  params->DuplexInit            = RESCALE_dG(DuplexInit37, DuplexInitdH, tempf);
  params->MLbase                = RESCALE_dG(ML_BASE37, ML_BASEdH, tempf);
  // Pseudoknot -- added by Mateo 2/14/23
  params->PS_penalty            = -138;
  params->PSM_penalty           = 1007; 
  params->PSP_penalty           = 1500; 
  params->PB_penalty            = 246; 
  params->PUP_penalty           = 6; 
  params->PPS_penalty           = 96; 
  params->e_stP_penalty         = .89; 
  params->e_intP_penalty        = .74;
  params->ap_penalty            = 341;
  params->bp_penalty            = 56;
  params->cp_penalty            = 12;
  params->a_penalty            = 339; // Fix later
  params->b_penalty            = 3;
  params->c_penalty            = 2;
  //
  params->MLclosing             = RESCALE_dG(ML_closing37, ML_closingdH, tempf);
  params->gquadLayerMismatch    = RESCALE_dG(GQuadLayerMismatch37, GQuadLayerMismatchH, tempf);
  params->gquadLayerMismatchMax = GQuadLayerMismatchMax;

  for (i = VRNA_GQUAD_MIN_STACK_SIZE; i <= VRNA_GQUAD_MAX_STACK_SIZE; i++)
    for (j = 3 * VRNA_GQUAD_MIN_LINKER_LENGTH; j <= 3 * VRNA_GQUAD_MAX_LINKER_LENGTH; j++) {
      double  GQuadAlpha_T  = RESCALE_dG(GQuadAlpha37, GQuadAlphadH, tempf);
      double  GQuadBeta_T   = RESCALE_dG(GQuadBeta37, GQuadBetadH, tempf);
      params->gquad[i][j] = (int)GQuadAlpha_T * (i - 1) + (int)(((double)GQuadBeta_T) * log(j - 2));
    }

  for (i = 0; i < 31; i++)
    params->hairpin[i] = RESCALE_dG(hairpin37[i], hairpindH[i], tempf);

  for (i = 0; i <= MIN2(30, MAXLOOP); i++) {
    params->bulge[i]          = RESCALE_dG(bulge37[i], bulgedH[i], tempf);
    params->internal_loop[i]  = RESCALE_dG(internal_loop37[i], internal_loopdH[i], tempf);
  }

  for (; i <= MAXLOOP; i++) {
    params->bulge[i] = params->bulge[30] +
                       (int)(params->lxc * log((double)(i) / 30.));
    params->internal_loop[i] = params->internal_loop[30] +
                               (int)(params->lxc * log((double)(i) / 30.));
  }

  for (i = 0; (i * 7) < strlen(Tetraloops); i++)
    params->Tetraloop_E[i] = RESCALE_dG(Tetraloop37[i], TetraloopdH[i], tempf);

  for (i = 0; (i * 5) < strlen(Triloops); i++)
    params->Triloop_E[i] = RESCALE_dG(Triloop37[i], TriloopdH[i], tempf);

  for (i = 0; (i * 9) < strlen(Hexaloops); i++)
    params->Hexaloop_E[i] = RESCALE_dG(Hexaloop37[i], HexaloopdH[i], tempf);

  for (i = 0; i <= NBPAIRS; i++)
    params->MLintern[i] = RESCALE_dG(ML_intern37, ML_interndH, tempf);

  /* stacks    G(T) = H - [H - G(T0)]*T/T0 */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      params->stack[i][j] = RESCALE_dG(stack37[i][j],
                                       stackdH[i][j],
                                       tempf);

  /* mismatches */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j < 5; j++)
      for (k = 0; k < 5; k++) {
        int mm;
        params->mismatchI[i][j][k] = RESCALE_dG(mismatchI37[i][j][k],
                                                mismatchIdH[i][j][k],
                                                tempf);
        params->mismatchH[i][j][k] = RESCALE_dG(mismatchH37[i][j][k],
                                                mismatchHdH[i][j][k],
                                                tempf);
        params->mismatch1nI[i][j][k] = RESCALE_dG(mismatch1nI37[i][j][k],
                                                  mismatch1nIdH[i][j][k],
                                                  tempf);
        params->mismatch23I[i][j][k] = RESCALE_dG(mismatch23I37[i][j][k],
                                                  mismatch23IdH[i][j][k],
                                                  tempf);
        if (md->dangles) {
          mm = RESCALE_dG(mismatchM37[i][j][k],
                          mismatchMdH[i][j][k],
                          tempf);
          params->mismatchM[i][j][k]  = (mm > 0) ? 0 : mm;
          mm                          = RESCALE_dG(mismatchExt37[i][j][k],
                                                   mismatchExtdH[i][j][k],
                                                   tempf);
          params->mismatchExt[i][j][k] = (mm > 0) ? 0 : mm;
        } else {
          params->mismatchM[i][j][k] = params->mismatchExt[i][j][k] = 0;
        }
      }

  /* dangles */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j < 5; j++) {
      int dd;
      dd = RESCALE_dG(dangle5_37[i][j],
                      dangle5_dH[i][j],
                      tempf);
      params->dangle5[i][j] = (dd > 0) ? 0 : dd;  /* must be <= 0 */
      dd                    = RESCALE_dG(dangle3_37[i][j],
                                         dangle3_dH[i][j],
                                         tempf);
      params->dangle3[i][j] = (dd > 0) ? 0 : dd;  /* must be <= 0 */
    }

  /* interior 1x1 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++)
          params->int11[i][j][k][l] = RESCALE_dG(int11_37[i][j][k][l],
                                                 int11_dH[i][j][k][l],
                                                 tempf);

  /* interior 2x1 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m;
          for (m = 0; m < 5; m++)
            params->int21[i][j][k][l][m] = RESCALE_dG(int21_37[i][j][k][l][m],
                                                      int21_dH[i][j][k][l][m],
                                                      tempf);
        }

  /* interior 2x2 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m, n;
          for (m = 0; m < 5; m++)
            for (n = 0; n < 5; n++)
              params->int22[i][j][k][l][m][n] = RESCALE_dG(int22_37[i][j][k][l][m][n],
                                                           int22_dH[i][j][k][l][m][n],
                                                           tempf);
        }

  strncpy(params->Tetraloops, Tetraloops, 281);
  strncpy(params->Triloops, Triloops, 241);
  strncpy(params->Hexaloops, Hexaloops, 361);

  params->id = ++id;
  return params;
}